

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3;
  PortDeclarationSyntax *pPVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  not_null<slang::syntax::PortHeaderSyntax_*>::operator*
            ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x59831e);
  args_2 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
           deepClone<slang::syntax::PortHeaderSyntax>
                     ((PortHeaderSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  args_3 = deepClone<slang::syntax::DeclaratorSyntax>(in_stack_00000110,in_stack_00000108);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PortDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PortHeaderSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_,args_2,(Token *)args_3);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PortDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PortDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PortHeaderSyntax>(*node.header, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}